

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

bool __thiscall asmjit::CodeEmitter::isLabelValid(CodeEmitter *this,uint32_t id)

{
  bool local_29;
  size_t index;
  uint32_t id_local;
  CodeEmitter *this_local;
  
  local_29 = false;
  if (this->_code != (CodeHolder *)0x0) {
    local_29 = (ulong)(id - 0x100) < (this->_code->_labels).super_ZoneVectorBase._length;
  }
  return local_29;
}

Assistant:

bool CodeEmitter::isLabelValid(uint32_t id) const noexcept {
  size_t index = Operand::unpackId(id);
  return _code && index < _code->_labels.getLength();
}